

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# long_parse.c
# Opt level: O0

class_type parse_class_type(char *str)

{
  int iVar1;
  long local_28;
  size_t i;
  class_type result;
  char *str_local;
  
  i._4_4_ = CLASS_LEC;
  local_28 = 0;
  while( true ) {
    if (class_types[local_28] == (char *)0x0) {
      return CLASS_NONE;
    }
    iVar1 = strcmp(str,class_types[local_28]);
    if (iVar1 == 0) break;
    local_28 = local_28 + 1;
    i._4_4_ = i._4_4_ + CLASS_DIS;
  }
  return i._4_4_;
}

Assistant:

enum class_type parse_class_type(const char *str)
{
	enum class_type result = CLASS_LEC;
	size_t i;

	for (i = 0; class_types[i]; i++, result++) {
		if (!strcmp(str, class_types[i])) {
			return result;
		}
	}

	return CLASS_NONE;
}